

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFoodWeb_kry.c
# Opt level: O1

void FreeUserData(UserData data)

{
  long lVar1;
  sunindextype *(*papsVar2) [8];
  long lVar3;
  
  papsVar2 = data->pivot;
  lVar3 = 0;
  do {
    lVar1 = 0;
    do {
      SUNDlsMat_destroyMat(((anon_struct_1144_17_53511772 *)(papsVar2 + -8))->P[0][lVar1]);
      SUNDlsMat_destroyArray((*papsVar2)[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 8);
    lVar3 = lVar3 + 1;
    papsVar2 = papsVar2 + 1;
  } while (lVar3 != 8);
  SUNDlsMat_destroyMat(data->acoef);
  free(data->bcoef);
  free(data->cox);
  free(data->coy);
  N_VDestroy(data->rates);
  free(data);
  return;
}

Assistant:

static void FreeUserData(UserData data)
{
  int jx, jy;

  for (jx = 0; jx < MX; jx++)
  {
    for (jy = 0; jy < MY; jy++)
    {
      SUNDlsMat_destroyMat((data->P)[jx][jy]);
      SUNDlsMat_destroyArray((data->pivot)[jx][jy]);
    }
  }

  SUNDlsMat_destroyMat(acoef);
  free(bcoef);
  free(cox);
  free(coy);
  N_VDestroy(data->rates);
  free(data);
}